

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

uint * SoapySDRDevice_readRegisters(SoapySDRDevice *device,char *name,uint addr,size_t *length)

{
  undefined8 *in_RCX;
  undefined4 in_EDX;
  size_t *in_RSI;
  long *in_RDI;
  exception *ex;
  size_t inputLen;
  allocator *values;
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [24];
  undefined8 local_30;
  undefined4 local_1c;
  size_t *local_18;
  long *local_10;
  uint *local_8;
  
  local_30 = *in_RCX;
  *in_RCX = 0;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  values = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,(char *)local_18,values);
  (**(code **)(*local_10 + 0x318))(local_48,local_10,local_68,local_1c,local_30);
  local_8 = toNumericList((vector<unsigned_int,_std::allocator<unsigned_int>_> *)values,local_18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)values);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return local_8;
}

Assistant:

__SOAPY_SDR_C_CATCH
}

unsigned *SoapySDRDevice_readRegisters(const SoapySDRDevice *device, const char *name, const unsigned addr, size_t *length)
{
    const size_t inputLen = *length;
    *length = 0; //clear in case of error

    __SOAPY_SDR_C_TRY
    return toNumericList(device->readRegisters(name, addr, inputLen), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}